

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getNN
          (FastText *this,Matrix *wordVectors,Vector *query,int32_t k,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *banSet)

{
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __last;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __last_00;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __last_01;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first;
  bool bVar1;
  int32_t iVar2;
  element_type *this_00;
  const_iterator __x;
  size_type sVar3;
  reference pvVar4;
  int in_ECX;
  int64_t in_RSI;
  pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int in_R8D;
  float fVar5;
  real rVar6;
  float fVar7;
  real similarity;
  real dp;
  string word;
  int32_t i;
  real queryNorm;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *heap;
  value_type *in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffef0;
  int id;
  __normal_iterator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __first_00;
  undefined4 in_stack_ffffffffffffff18;
  real rVar8;
  Matrix *in_stack_ffffffffffffff20;
  _func_bool_pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr_pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr
  *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar9;
  real rVar10;
  _Self local_78;
  _Self local_70;
  string local_68 [32];
  int local_48;
  real local_38;
  undefined1 local_31;
  int local_24;
  int local_20;
  
  local_31 = 0;
  __first_00._M_current = in_RDI;
  local_24 = in_R8D;
  local_20 = in_ECX;
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x1779ee);
  fVar5 = Vector::norm((Vector *)__first_00._M_current);
  rVar8 = fVar5;
  local_38 = fVar5;
  std::abs(local_20);
  if (fVar5 < 1e-08) {
    local_38 = 1.0;
  }
  local_48 = 0;
  do {
    id = local_48;
    this_00 = std::
              __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x177a90);
    iVar2 = Dictionary::nwords(this_00);
    if (iVar2 <= id) {
      std::
      vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::begin((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffed8);
      std::
      vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffed8);
      __last_00._M_current._4_4_ = fVar5;
      __last_00._M_current._0_4_ = iVar2;
      std::
      sort_heap<__gnu_cxx::__normal_iterator<std::pair<float,std::__cxx11::string>*,std::vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>>,bool(*)(std::pair<float,std::__cxx11::string>const&,std::pair<float,std::__cxx11::string>const&)>
                (__first_00,__last_00,
                 (_func_bool_pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr_pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr
                  *)CONCAT44(id,in_stack_fffffffffffffef0));
      return (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_RDI;
    }
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x177abc);
    Dictionary::getWord_abi_cxx11_((Dictionary *)CONCAT44(fVar5,iVar2),id);
    __x = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffed8,(key_type *)0x177aea);
    local_70._M_node = __x._M_node;
    local_78._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffed8);
    bVar1 = std::operator==(&local_70,&local_78);
    if (bVar1) {
      rVar6 = Matrix::dotRow(in_stack_ffffffffffffff20,
                             (Vector *)CONCAT44(rVar8,in_stack_ffffffffffffff18),in_RSI);
      fVar7 = rVar6 / local_38;
      rVar10 = rVar6;
      sVar3 = std::
              vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)__first_00._M_current);
      fVar9 = fVar7;
      if ((sVar3 != (long)local_24) ||
         (pvVar4 = std::
                   vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::front((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(rVar6,fVar7)), in_stack_fffffffffffffee0 = fVar7,
         pvVar4->first <= fVar7)) {
        std::make_pair<float&,std::__cxx11::string&>
                  ((float *)__x._M_node,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(rVar6,in_stack_fffffffffffffee0));
        std::
        vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)CONCAT44(rVar6,in_stack_fffffffffffffee0),in_stack_fffffffffffffed8);
        std::
        pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x177c20);
        std::
        vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::begin((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffed8);
        std::
        vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::end((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffed8);
        __first._M_current._4_4_ = rVar10;
        __first._M_current._0_4_ = fVar9;
        __last_01._M_current._4_4_ = in_stack_ffffffffffffff7c;
        __last_01._M_current._0_4_ = in_stack_ffffffffffffff78;
        std::
        push_heap<__gnu_cxx::__normal_iterator<std::pair<float,std::__cxx11::string>*,std::vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>>,bool(*)(std::pair<float,std::__cxx11::string>const&,std::pair<float,std::__cxx11::string>const&)>
                  (__first,__last_01,in_stack_ffffffffffffff70);
        sVar3 = std::
                vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::size((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)__first_00._M_current);
        if ((ulong)(long)local_24 < sVar3) {
          std::
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffffed8);
          std::
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffed8);
          __last._M_current._4_4_ = fVar5;
          __last._M_current._0_4_ = iVar2;
          std::
          pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,std::__cxx11::string>*,std::vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>>,bool(*)(std::pair<float,std::__cxx11::string>const&,std::pair<float,std::__cxx11::string>const&)>
                    (__first_00,__last,
                     (_func_bool_pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr_pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_ptr
                      *)CONCAT44(id,in_stack_fffffffffffffef0));
          std::
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop_back((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x177cad);
        }
        goto LAB_00177cd1;
      }
      in_stack_ffffffffffffff7c = 4;
    }
    else {
LAB_00177cd1:
      in_stack_ffffffffffffff7c = 0;
      fVar7 = in_stack_fffffffffffffee0;
    }
    std::__cxx11::string::~string(local_68);
    local_48 = local_48 + 1;
    in_stack_fffffffffffffee0 = fVar7;
  } while( true );
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNN(
		const Matrix& wordVectors,
		const Vector& query,
		int32_t k,
		const std::set<std::string>& banSet) {
	std::vector<std::pair<real, std::string>> heap;

	real queryNorm = query.norm();
	if (std::abs(queryNorm) < 1e-8) {
		queryNorm = 1;
	}

	for (int32_t i = 0; i < dict_->nwords(); i++) {
		std::string word = dict_->getWord(i);
		if (banSet.find(word) == banSet.end()) {
			real dp = wordVectors.dotRow(query, i);
			real similarity = dp / queryNorm;

			if (heap.size() == k && similarity < heap.front().first) {
				continue;
			}
			heap.push_back(std::make_pair(similarity, word));
			std::push_heap(heap.begin(), heap.end(), comparePairs);
			if (heap.size() > k) {
				std::pop_heap(heap.begin(), heap.end(), comparePairs);
				heap.pop_back();
			}
		}
	}
	std::sort_heap(heap.begin(), heap.end(), comparePairs);

	return heap;
}